

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBootstrapCommands1.cxx
# Opt level: O0

void GetBootstrapCommands1(vector<cmCommand_*,_std::allocator<cmCommand_*>_> *commands)

{
  vector<cmCommand_*,_std::allocator<cmCommand_*>_> *pvVar1;
  value_type pcVar2;
  cmCMakeMinimumRequired *this;
  cmConfigureFileCommand *this_00;
  cmDefinePropertyCommand *this_01;
  cmFindPackageCommand *this_02;
  value_type local_130;
  value_type local_128;
  value_type local_120;
  value_type local_118;
  cmFindPackageCommand *local_110;
  value_type local_108;
  value_type local_100;
  value_type local_f8;
  value_type local_f0;
  value_type local_e8;
  value_type local_e0;
  value_type local_d8;
  value_type local_d0;
  value_type local_c8;
  value_type local_c0;
  value_type local_b8;
  value_type local_b0;
  value_type local_a8;
  cmDefinePropertyCommand *local_a0;
  value_type local_98;
  value_type local_90;
  cmConfigureFileCommand *local_88;
  value_type local_80;
  cmCMakeMinimumRequired *local_78;
  value_type local_70;
  value_type local_68;
  value_type local_60;
  value_type local_58;
  value_type local_50;
  value_type local_48;
  value_type local_40;
  value_type local_38;
  value_type local_30 [3];
  value_type local_18;
  vector<cmCommand_*,_std::allocator<cmCommand_*>_> *local_10;
  vector<cmCommand_*,_std::allocator<cmCommand_*>_> *commands_local;
  
  local_10 = commands;
  pcVar2 = (value_type)operator_new(0x50);
  cmAddCustomCommandCommand::cmAddCustomCommandCommand((cmAddCustomCommandCommand *)pcVar2);
  local_18 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(commands,&local_18);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmAddCustomTargetCommand::cmAddCustomTargetCommand((cmAddCustomTargetCommand *)pcVar2);
  local_30[0] = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,local_30);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmAddDefinitionsCommand::cmAddDefinitionsCommand((cmAddDefinitionsCommand *)pcVar2);
  local_38 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_38);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmAddDependenciesCommand::cmAddDependenciesCommand((cmAddDependenciesCommand *)pcVar2);
  local_40 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_40);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmAddExecutableCommand::cmAddExecutableCommand((cmAddExecutableCommand *)pcVar2);
  local_48 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_48);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmAddLibraryCommand::cmAddLibraryCommand((cmAddLibraryCommand *)pcVar2);
  local_50 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_50);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmAddSubDirectoryCommand::cmAddSubDirectoryCommand((cmAddSubDirectoryCommand *)pcVar2);
  local_58 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_58);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmAddTestCommand::cmAddTestCommand((cmAddTestCommand *)pcVar2);
  local_60 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_60);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmBreakCommand::cmBreakCommand((cmBreakCommand *)pcVar2);
  local_68 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_68);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmBuildCommand::cmBuildCommand((cmBuildCommand *)pcVar2);
  local_70 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_70);
  pvVar1 = local_10;
  this = (cmCMakeMinimumRequired *)operator_new(0x68);
  cmCMakeMinimumRequired::cmCMakeMinimumRequired(this);
  local_78 = this;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,(value_type *)&local_78);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmCMakePolicyCommand::cmCMakePolicyCommand((cmCMakePolicyCommand *)pcVar2);
  local_80 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_80);
  pvVar1 = local_10;
  this_00 = (cmConfigureFileCommand *)operator_new(0xa0);
  cmConfigureFileCommand::cmConfigureFileCommand(this_00);
  local_88 = this_00;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,(value_type *)&local_88);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmContinueCommand::cmContinueCommand((cmContinueCommand *)pcVar2);
  local_90 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_90);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmCreateTestSourceList::cmCreateTestSourceList((cmCreateTestSourceList *)pcVar2);
  local_98 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_98);
  pvVar1 = local_10;
  this_01 = (cmDefinePropertyCommand *)operator_new(0xb0);
  cmDefinePropertyCommand::cmDefinePropertyCommand(this_01);
  local_a0 = this_01;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,(value_type *)&local_a0);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmElseCommand::cmElseCommand((cmElseCommand *)pcVar2);
  local_a8 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_a8);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmEnableLanguageCommand::cmEnableLanguageCommand((cmEnableLanguageCommand *)pcVar2);
  local_b0 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_b0);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmEnableTestingCommand::cmEnableTestingCommand((cmEnableTestingCommand *)pcVar2);
  local_b8 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_b8);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmEndForEachCommand::cmEndForEachCommand((cmEndForEachCommand *)pcVar2);
  local_c0 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_c0);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmEndFunctionCommand::cmEndFunctionCommand((cmEndFunctionCommand *)pcVar2);
  local_c8 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_c8);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmEndIfCommand::cmEndIfCommand((cmEndIfCommand *)pcVar2);
  local_d0 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_d0);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmEndMacroCommand::cmEndMacroCommand((cmEndMacroCommand *)pcVar2);
  local_d8 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_d8);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmEndWhileCommand::cmEndWhileCommand((cmEndWhileCommand *)pcVar2);
  local_e0 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_e0);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmExecProgramCommand::cmExecProgramCommand((cmExecProgramCommand *)pcVar2);
  local_e8 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_e8);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmExecuteProcessCommand::cmExecuteProcessCommand((cmExecuteProcessCommand *)pcVar2);
  local_f0 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_f0);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmFileCommand::cmFileCommand((cmFileCommand *)pcVar2);
  local_f8 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_f8);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x248);
  cmFindFileCommand::cmFindFileCommand((cmFindFileCommand *)pcVar2);
  local_100 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_100);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x248);
  cmFindLibraryCommand::cmFindLibraryCommand((cmFindLibraryCommand *)pcVar2);
  local_108 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_108);
  pvVar1 = local_10;
  this_02 = (cmFindPackageCommand *)operator_new(0x370);
  cmFindPackageCommand::cmFindPackageCommand(this_02);
  local_110 = this_02;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,(value_type *)&local_110)
  ;
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x248);
  cmFindPathCommand::cmFindPathCommand((cmFindPathCommand *)pcVar2);
  local_118 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_118);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x248);
  cmFindProgramCommand::cmFindProgramCommand((cmFindProgramCommand *)pcVar2);
  local_120 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_120);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmForEachCommand::cmForEachCommand((cmForEachCommand *)pcVar2);
  local_128 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_128);
  pvVar1 = local_10;
  pcVar2 = (value_type)operator_new(0x50);
  cmFunctionCommand::cmFunctionCommand((cmFunctionCommand *)pcVar2);
  local_130 = pcVar2;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back(pvVar1,&local_130);
  return;
}

Assistant:

void GetBootstrapCommands1(std::vector<cmCommand*>& commands)
{
  commands.push_back(new cmAddCustomCommandCommand);
  commands.push_back(new cmAddCustomTargetCommand);
  commands.push_back(new cmAddDefinitionsCommand);
  commands.push_back(new cmAddDependenciesCommand);
  commands.push_back(new cmAddExecutableCommand);
  commands.push_back(new cmAddLibraryCommand);
  commands.push_back(new cmAddSubDirectoryCommand);
  commands.push_back(new cmAddTestCommand);
  commands.push_back(new cmBreakCommand);
  commands.push_back(new cmBuildCommand);
  commands.push_back(new cmCMakeMinimumRequired);
  commands.push_back(new cmCMakePolicyCommand);
  commands.push_back(new cmConfigureFileCommand);
  commands.push_back(new cmContinueCommand);
  commands.push_back(new cmCreateTestSourceList);
  commands.push_back(new cmDefinePropertyCommand);
  commands.push_back(new cmElseCommand);
  commands.push_back(new cmEnableLanguageCommand);
  commands.push_back(new cmEnableTestingCommand);
  commands.push_back(new cmEndForEachCommand);
  commands.push_back(new cmEndFunctionCommand);
  commands.push_back(new cmEndIfCommand);
  commands.push_back(new cmEndMacroCommand);
  commands.push_back(new cmEndWhileCommand);
  commands.push_back(new cmExecProgramCommand);
  commands.push_back(new cmExecuteProcessCommand);
  commands.push_back(new cmFileCommand);
  commands.push_back(new cmFindFileCommand);
  commands.push_back(new cmFindLibraryCommand);
  commands.push_back(new cmFindPackageCommand);
  commands.push_back(new cmFindPathCommand);
  commands.push_back(new cmFindProgramCommand);
  commands.push_back(new cmForEachCommand);
  commands.push_back(new cmFunctionCommand);
}